

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsbr.hpp
# Opt level: O2

void __thiscall unodb::detail::deferred_requests::~deferred_requests(deferred_requests *this)

{
  pointer pdVar1;
  dealloc_request_vector *__range2;
  deallocation_request *dealloc_request;
  pointer this_00;
  
  pdVar1 = (this->requests).
           super__Vector_base<unodb::detail::deallocation_request,_std::allocator<unodb::detail::deallocation_request>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->requests).
                 super__Vector_base<unodb::detail::deallocation_request,_std::allocator<unodb::detail::deallocation_request>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pdVar1; this_00 = this_00 + 1
      ) {
    deallocation_request::deallocate
              (this_00,this->orphaned_requests,
               (optional<unodb::detail::qsbr_epoch>)
               (this->dealloc_epoch).super__Optional_base<unodb::detail::qsbr_epoch,_true,_true>.
               _M_payload.super__Optional_payload_base<unodb::detail::qsbr_epoch>,
               (optional<bool>)
               (this->dealloc_epoch_single_thread_mode).super__Optional_base<bool,_true,_true>.
               _M_payload.super__Optional_payload_base<bool>);
  }
  std::
  vector<unodb::detail::deallocation_request,_std::allocator<unodb::detail::deallocation_request>_>
  ::~vector(&this->requests);
  return;
}

Assistant:

~deferred_requests() noexcept {
    for (const auto &dealloc_request : requests) {
      dealloc_request.deallocate(
#ifndef NDEBUG
          orphaned_requests, dealloc_epoch, dealloc_epoch_single_thread_mode
#endif
      );
    }
  }